

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEditPrivate::~QTextEditPrivate(QTextEditPrivate *this)

{
  long lVar1;
  
  *(undefined ***)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
       = &PTR__QTextEditPrivate_007d6b48;
  for (lVar1 = 0x360; lVar1 != 0x3c8; lVar1 = lVar1 + 8) {
    QObject::disconnect((Connection *)
                        (&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                          super_QWidgetPrivate.super_QObjectPrivate + lVar1));
  }
  std::array<QMetaObject::Connection,_13UL>::~array(&this->connections);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->placeholderText).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->anchorToScrollToWhenVisible).d);
  QBasicTimer::~QBasicTimer(&this->autoScrollTimer);
  QAbstractScrollAreaPrivate::~QAbstractScrollAreaPrivate(&this->super_QAbstractScrollAreaPrivate);
  return;
}

Assistant:

QTextEditPrivate::~QTextEditPrivate()
{
    for (const QMetaObject::Connection &connection : connections)
        QObject::disconnect(connection);
}